

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O1

int gdImageSubSharpen(int pc,int c,int nc,float inner_coeff,float outer_coeff)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = (float)((uint)c >> 0x10 & 0xff) * inner_coeff +
          (float)(((uint)nc >> 0x10 & 0xff) + ((uint)pc >> 0x10 & 0xff)) * outer_coeff;
  fVar3 = (float)((uint)c >> 8 & 0xff) * inner_coeff +
          (float)(((uint)nc >> 8 & 0xff) + ((uint)pc >> 8 & 0xff)) * outer_coeff;
  fVar4 = (float)(c & 0xff) * inner_coeff + (float)((nc & 0xffU) + (pc & 0xffU)) * outer_coeff;
  fVar1 = 255.0;
  if (fVar2 <= 255.0) {
    fVar1 = fVar2;
  }
  fVar2 = 255.0;
  if (fVar3 <= 255.0) {
    fVar2 = fVar3;
  }
  fVar3 = 255.0;
  if (fVar4 <= 255.0) {
    fVar3 = fVar4;
  }
  fVar4 = 0.0;
  if (0.0 <= fVar1) {
    fVar4 = fVar1;
  }
  fVar1 = 0.0;
  if (0.0 <= fVar2) {
    fVar1 = fVar2;
  }
  fVar2 = 0.0;
  if (0.0 <= fVar3) {
    fVar2 = fVar3;
  }
  return (int)fVar2 + (c & 0x7f000000U) + (int)fVar4 * 0x10000 + (int)fVar1 * 0x100;
}

Assistant:

int
gdImageSubSharpen (int pc, int c, int nc, float inner_coeff, float
                   outer_coeff)
{
	float red, green, blue, alpha;

	red = inner_coeff * gdTrueColorGetRed (c) + outer_coeff *
	      (gdTrueColorGetRed (pc) + gdTrueColorGetRed (nc));
	green = inner_coeff * gdTrueColorGetGreen (c) + outer_coeff *
	        (gdTrueColorGetGreen (pc) + gdTrueColorGetGreen (nc));
	blue = inner_coeff * gdTrueColorGetBlue (c) + outer_coeff *
	       (gdTrueColorGetBlue (pc) + gdTrueColorGetBlue (nc));
	alpha = gdTrueColorGetAlpha (c);

	/* Clamping, as can overshoot bounds in either direction */
	if (red > 255.0f) {
		red = 255.0f;
	}
	if (green > 255.0f) {
		green = 255.0f;
	}
	if (blue > 255.0f) {
		blue = 255.0f;
	}
	if (red < 0.0f) {
		red = 0.0f;
	}
	if (green < 0.0f) {
		green = 0.0f;
	}
	if (blue < 0.0f) {
		blue = 0.0f;
	}

	return gdTrueColorAlpha ((int) red, (int) green, (int) blue, (int) alpha);
}